

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O0

bool __thiscall
ec::base_protobuf::get_length_delimited
          (base_protobuf *this,uint8_t **pd,int *len,uint8_t **pout,size_t *outlen)

{
  bool bVar1;
  uint local_3c;
  size_t *psStack_38;
  uint32_t ul;
  size_t *outlen_local;
  uint8_t **pout_local;
  int *len_local;
  uint8_t **pd_local;
  base_protobuf *this_local;
  
  local_3c = 0;
  psStack_38 = outlen;
  outlen_local = (size_t *)pout;
  pout_local = (uint8_t **)len;
  len_local = (int *)pd;
  pd_local = (uint8_t **)this;
  bVar1 = get_varint<unsigned_int,void>(this,pd,len,&local_3c);
  if (bVar1) {
    if (*(int *)pout_local < (int)local_3c) {
      this->_lasterr = 2;
      this_local._7_1_ = false;
    }
    else {
      *outlen_local = *(size_t *)len_local;
      *(ulong *)len_local = *(long *)len_local + (ulong)local_3c;
      *(uint *)pout_local = *(int *)pout_local - local_3c;
      *psStack_38 = (ulong)local_3c;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool get_length_delimited(const uint8_t *&pd, int &len, const uint8_t *&pout, size_t &outlen) //get string, bytes,no copy
    {
        uint32_t ul = 0;

        if (!get_varint(pd, len, ul)) {
            return false;
        }

        if (len < (int)ul) {
            _lasterr = pberr_decode;
            return false;
        }

        pout = pd;
        pd += ul;
        len -= ul;
        outlen = ul;
        return true;
    }